

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

int Gia_ManTerRetire2(Gia_ManTer_t *p,uint *pState)

{
  uint *pInfo;
  int iVar1;
  int iVar2;
  int local_24;
  int iMaxTerValue;
  int Entry;
  int i;
  uint *pState_local;
  Gia_ManTer_t *p_local;
  
  local_24 = -1;
  for (iMaxTerValue = 0; iVar1 = Gia_ManRegNum(p->pAig), iMaxTerValue < iVar1;
      iMaxTerValue = iMaxTerValue + 1) {
    iVar1 = Gia_ManTerSimInfoGet(pState,iMaxTerValue);
    if (((iVar1 != 3) && (p->pRetired[iMaxTerValue] == '\0')) &&
       (local_24 < p->pCountX[iMaxTerValue])) {
      local_24 = p->pCountX[iMaxTerValue];
    }
  }
  if (local_24 < 0) {
    __assert_fail("iMaxTerValue >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                  ,0x1a6,"int Gia_ManTerRetire2(Gia_ManTer_t *, unsigned int *)");
  }
  for (iMaxTerValue = 0; iVar1 = Gia_ManRegNum(p->pAig), iMaxTerValue < iVar1;
      iMaxTerValue = iMaxTerValue + 1) {
    iVar1 = Gia_ManTerSimInfoGet(pState,iMaxTerValue);
    if (((iVar1 != 3) && (p->pRetired[iMaxTerValue] == '\0')) &&
       (local_24 == p->pCountX[iMaxTerValue])) {
      if (p->pRetired[iMaxTerValue] != '\0') {
        __assert_fail("p->pRetired[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                      ,0x1ab,"int Gia_ManTerRetire2(Gia_ManTer_t *, unsigned int *)");
      }
      p->pRetired[iMaxTerValue] = '\x01';
      Vec_IntPush(p->vRetired,iMaxTerValue);
      if (local_24 == 0) break;
    }
  }
  for (iMaxTerValue = 0; iVar1 = Vec_IntSize(p->vRetired), iMaxTerValue < iVar1;
      iMaxTerValue = iMaxTerValue + 1) {
    iVar1 = Vec_IntEntry(p->vRetired,iMaxTerValue);
    pInfo = p->pDataSimCis;
    iVar2 = Gia_ManPiNum(p->pAig);
    Gia_ManTerSimInfoSet(pInfo,iVar2 + iVar1,3);
  }
  iVar1 = Vec_IntSize(p->vRetired);
  return iVar1;
}

Assistant:

int Gia_ManTerRetire2( Gia_ManTer_t * p, unsigned * pState )
{
    int i, Entry, iMaxTerValue = -1;
    // find non-retired register with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue < p->pCountX[i] )
            iMaxTerValue = p->pCountX[i];
    assert( iMaxTerValue >= 0 );
    // retire the first registers with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue == p->pCountX[i] )
        {
            assert( p->pRetired[i] == 0 );
            p->pRetired[i] = 1;
            Vec_IntPush( p->vRetired, i );
            if ( iMaxTerValue == 0 )
                break;
        }
    // update all the retired registers
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}